

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

uint8_t * ures_getBinary_63(UResourceBundle *resB,int32_t *len,UErrorCode *status)

{
  UErrorCode UVar1;
  uint8_t *puVar2;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      UVar1 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      puVar2 = res_getBinary_63(&resB->fResData,resB->fRes,len);
      if (puVar2 != (uint8_t *)0x0) {
        return puVar2;
      }
      UVar1 = U_RESOURCE_TYPE_MISMATCH;
    }
    *status = UVar1;
  }
  return (uint8_t *)0x0;
}

Assistant:

U_CAPI const uint8_t* U_EXPORT2 ures_getBinary(const UResourceBundle* resB, int32_t* len, 
                                               UErrorCode*               status) {
  const uint8_t *p;
  if (status==NULL || U_FAILURE(*status)) {
    return NULL;
  }
  if(resB == NULL) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return NULL;
  }
  p = res_getBinary(&(resB->fResData), resB->fRes, len);
  if (p == NULL) {
    *status = U_RESOURCE_TYPE_MISMATCH;
  }
  return p;
}